

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3SegmentMerge(Fts3Table *p,int iLangid,int iIndex,int iLevel)

{
  SegmentNode *pTree;
  sqlite3_uint64 sVar1;
  char *zNext;
  int iVar2;
  int iIdx;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  SegmentNode *ppTree;
  SegmentNode *pSVar7;
  void *pvVar8;
  char *pcVar9;
  uint uVar10;
  long lVar11;
  SegmentNode *pSVar12;
  undefined4 uVar13;
  undefined8 extraout_RDX;
  ulong iValue;
  long lVar14;
  SegmentNode *pSVar15;
  SegmentNode *iBlock;
  sqlite3_stmt *psVar16;
  undefined8 uVar17;
  undefined1 *iEndBlock;
  uint uVar18;
  SegmentNode *iLeftChild;
  long lVar19;
  sqlite3_int64 sVar20;
  SegmentNode **ppSVar21;
  sqlite3_int64 local_118;
  int local_f4;
  sqlite3_stmt *local_e8;
  sqlite3_int64 local_e0;
  long local_d8;
  sqlite3_uint64 local_d0;
  undefined4 local_c4;
  sqlite3_uint64 local_c0;
  SegmentNode *local_b8;
  char *local_b0;
  Fts3SegFilter local_a8;
  Fts3MultiSegReader csr;
  
  uVar17 = 0;
  iVar2 = sqlite3Fts3SegReaderCursor(p,iLangid,iIndex,iLevel,(char *)0x0,0,1,0,&csr);
  iVar6 = csr.nSegment;
  if (csr.nSegment == 0 || iVar2 != 0) goto LAB_001bd4e1;
  lVar19 = (long)iLangid;
  lVar11 = (long)iIndex;
  lVar14 = (long)iLevel;
  if (iLevel == -1) {
    local_e0 = 0;
  }
  else {
    iVar2 = fts3SqlStmt(p,0xf,(sqlite3_stmt **)&local_a8,(sqlite3_value **)0x0);
    pcVar9 = local_a8.zTerm;
    if (iVar2 != 0) goto LAB_001bd4e1;
    local_d8 = lVar14;
    sqlite3_bind_int64((sqlite3_stmt *)local_a8.zTerm,1,(p->nIndex * lVar19 + lVar11) * 0x400);
    sqlite3_bind_int64((sqlite3_stmt *)pcVar9,2,(p->nIndex * lVar19 + lVar11) * 0x400 | 0x3ff);
    iVar2 = sqlite3_step((sqlite3_stmt *)pcVar9);
    if (iVar2 == 100) {
      local_118 = sqlite3_column_int64((sqlite3_stmt *)pcVar9,0);
    }
    else {
      local_118 = 0;
    }
    iVar2 = sqlite3_reset((sqlite3_stmt *)pcVar9);
    if (iVar2 != 0) goto LAB_001bd4e1;
    if (iLevel == -2) {
      uVar13 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      iIdx = 0;
      uVar10 = 3;
      sVar20 = local_118;
      if ((iVar6 == 1) && ((*csr.apSegment)->ppNextElem == (Fts3HashElem **)0x0)) {
        iVar2 = 0x65;
        goto LAB_001bd4e1;
      }
      goto LAB_001bd107;
    }
    local_e0 = local_118;
    lVar14 = local_d8;
  }
  local_118 = lVar14 + (p->nIndex * lVar19 + lVar11) * 0x400 + 1;
  iVar2 = fts3SqlStmt(p,8,(sqlite3_stmt **)&local_a8,(sqlite3_value **)0x0);
  pcVar9 = local_a8.zTerm;
  local_d8 = lVar14;
  if (iVar2 == 0) {
    sqlite3_bind_int64((sqlite3_stmt *)local_a8.zTerm,1,
                       (lVar19 * p->nIndex + lVar11) * 0x400 + lVar14 + 1);
    iVar2 = sqlite3_step((sqlite3_stmt *)pcVar9);
    iIdx = 0;
    if (iVar2 == 100) {
      iIdx = sqlite3_column_int((sqlite3_stmt *)pcVar9,0);
    }
    iVar2 = sqlite3_reset((sqlite3_stmt *)pcVar9);
    sVar20 = local_e0;
    if (iVar2 == 0) {
      iVar2 = 0;
      if (iIdx < 0x10) goto LAB_001bd0e0;
      iVar2 = fts3SegmentMerge(p,iLangid,iIndex,(int)(lVar14 + 1));
    }
    iIdx = 0;
  }
  else {
    iIdx = 0;
    sVar20 = local_e0;
  }
LAB_001bd0e0:
  if (iVar2 == 0) {
    uVar10 = (uint)(iLevel != -1 && sVar20 < local_118) * 2 + 1;
    uVar13 = 0;
LAB_001bd107:
    pcVar9 = (char *)0x1;
    local_f4 = 1;
    local_a8.zTerm = (char *)0x0;
    local_a8.nTerm = 0;
    local_a8.iCol = 0;
    local_a8._20_4_ = 0;
    local_a8.flags = uVar10;
    local_e0 = sVar20;
    local_c4 = uVar13;
    iVar2 = sqlite3Fts3SegReaderStart(p,&csr,&local_a8);
    ppTree = (SegmentNode *)0x0;
LAB_001bd145:
    if (iVar2 != 0) goto LAB_001bd7d6;
    iVar2 = sqlite3Fts3SegReaderStep(p,&csr);
    iVar6 = csr.nTerm;
    zNext = csr.zTerm;
    if (iVar2 == 100) {
      local_b0 = csr.aDoclist;
      local_d0 = (sqlite3_uint64)csr.nDoclist;
      if (ppTree == (SegmentNode *)0x0) goto LAB_001bd2a3;
      goto LAB_001bd1a4;
    }
    if (iVar2 != 0) goto LAB_001bd7d6;
    if (iLevel == -1) {
      if (ppTree != (SegmentNode *)0x0) goto LAB_001bd5f0;
      iVar2 = 0;
      goto LAB_001bd4e1;
    }
    local_e8 = (sqlite3_stmt *)0x0;
    iVar2 = 0;
    for (lVar14 = 0; (iVar2 == 0 && (lVar14 < csr.nSegment)); lVar14 = lVar14 + 1) {
      iVar2 = fts3DeleteSegment(p,csr.apSegment[lVar14]);
    }
    if (iVar2 == 0) {
      if ((char)local_c4 == '\0') {
        iVar2 = fts3SqlStmt(p,0x10,&local_e8,(sqlite3_value **)0x0);
        if (iVar2 == 0) {
          iValue = ((long)iIndex + (long)p->nIndex * (long)iLangid) * 0x400 + local_d8;
          iVar2 = 1;
          psVar16 = local_e8;
          goto LAB_001bd732;
        }
        goto LAB_001bd7d6;
      }
      iVar2 = fts3SqlStmt(p,0x1a,&local_e8,(sqlite3_value **)0x0);
      psVar16 = local_e8;
      if (iVar2 != 0) goto LAB_001bd7d6;
      sqlite3_bind_int64(local_e8,1,((long)p->nIndex * (long)iLangid + (long)iIndex) * 0x400);
      iValue = ((long)p->nIndex * (long)iLangid + (long)iIndex) * 0x400 | 0x3ff;
      iVar2 = 2;
LAB_001bd732:
      sqlite3_bind_int64(psVar16,iVar2,iValue);
      sqlite3_step(psVar16);
      iVar2 = sqlite3_reset(psVar16);
      if (iVar2 != 0 || ppTree == (SegmentNode *)0x0) goto LAB_001bd7d6;
LAB_001bd5f0:
      if (ppTree->pParent == (SegmentNode *)0x0) {
        iVar2 = *(int *)((long)&ppTree->zMalloc + 4);
        pSVar12 = (SegmentNode *)0x0;
        pSVar7 = (SegmentNode *)0x0;
        iEndBlock = (undefined1 *)0x0;
        pcVar9 = *(char **)&ppTree->nData;
LAB_001bd7a4:
        iVar2 = fts3WriteSegdir(p,local_118,iIdx,(sqlite3_int64)pSVar12,(sqlite3_int64)pSVar7,
                                (sqlite3_int64)iEndBlock,(sqlite3_int64)ppTree->aData,pcVar9,iVar2);
      }
      else {
        pSVar7 = ppTree->pLeftmost;
        ppTree->pLeftmost = (SegmentNode *)((long)&pSVar7->pParent + 1);
        iVar2 = fts3WriteSegment(p,(sqlite3_int64)pSVar7,*(char **)&ppTree->nData,
                                 *(int *)((long)&ppTree->zMalloc + 4));
        if (iVar2 == 0) {
          iBlock = ppTree->pLeftmost;
          pSVar12 = ppTree;
          iLeftChild = ppTree->pRight;
          while( true ) {
            pSVar15 = iBlock;
            pSVar12 = pSVar12->pParent;
            if (pSVar12->pParent == (SegmentNode *)0x0) {
              iVar6 = fts3TreeFinishNode(pSVar12,local_f4,(sqlite3_int64)iLeftChild);
              iEndBlock = (undefined1 *)((long)&pSVar15[-1].aData + 7);
              iVar2 = pSVar12->nData - iVar6;
              pcVar9 = pSVar12->aData + iVar6;
              pSVar12 = ppTree->pRight;
              goto LAB_001bd7a4;
            }
            ppSVar21 = &pSVar12->pLeftmost;
            iVar2 = 0;
            iBlock = pSVar15;
            while ((pTree = *ppSVar21, pTree != (SegmentNode *)0x0 && (iVar2 == 0))) {
              iVar2 = fts3TreeFinishNode(pTree,local_f4,(sqlite3_int64)iLeftChild);
              iVar2 = fts3WriteSegment(p,(sqlite3_int64)iBlock,pTree->aData + iVar2,
                                       pTree->nData - iVar2);
              iBlock = (SegmentNode *)((long)&iBlock->pParent + 1);
              iLeftChild = (SegmentNode *)((long)&iLeftChild->pParent + (long)pTree->nEntry + 1);
              ppSVar21 = &pTree->pRight;
            }
            if (iVar2 != 0) break;
            local_f4 = local_f4 + 1;
            iLeftChild = pSVar15;
          }
        }
      }
      p->nLeafAdd = p->nLeafAdd + 1;
      if ((iVar2 != 0) || ((iLevel != -1 && (iVar2 = 0, local_e0 <= local_118)))) goto LAB_001bd7d6;
      iVar2 = fts3PromoteSegments(p,local_118,(sqlite3_int64)ppTree->aData);
    }
    else {
LAB_001bd7d6:
      if (ppTree == (SegmentNode *)0x0) goto LAB_001bd4e1;
    }
    sqlite3_free(*(void **)&ppTree->nData);
    sqlite3_free(*(void **)&ppTree->nTerm);
    fts3NodeFree(ppTree->pParent);
    sqlite3_free(ppTree);
  }
LAB_001bd4e1:
  sqlite3Fts3SegReaderFinish(&csr);
  return iVar2;
LAB_001bd2a3:
  ppTree = (SegmentNode *)sqlite3_malloc(0x48);
  iVar2 = 7;
  if (ppTree != (SegmentNode *)0x0) {
    ppTree->zMalloc = (char *)0x0;
    *(undefined8 *)&ppTree->nData = 0;
    ppTree->zTerm = (char *)0x0;
    ppTree->nTerm = 0;
    ppTree->nMalloc = 0;
    ppTree->pLeftmost = (SegmentNode *)0x0;
    *(undefined8 *)&ppTree->nEntry = 0;
    ppTree->pParent = (SegmentNode *)0x0;
    ppTree->pRight = (SegmentNode *)0x0;
    ppTree->aData = (char *)0x0;
    pvVar8 = sqlite3_malloc(p->nNodeSize);
    *(void **)&ppTree->nData = pvVar8;
    iVar2 = 7;
    if (pvVar8 != (void *)0x0) {
      *(int *)&ppTree->zMalloc = p->nNodeSize;
      pcVar9 = (char *)0x0;
      iVar2 = fts3SqlStmt(p,10,&local_e8,(sqlite3_value **)0x0);
      psVar16 = local_e8;
      if (iVar2 == 0) {
        iVar2 = sqlite3_step(local_e8);
        if (iVar2 == 100) {
          pSVar7 = (SegmentNode *)sqlite3_column_int64(psVar16,0);
          ppTree->pLeftmost = pSVar7;
          ppTree->pRight = pSVar7;
        }
        iVar2 = sqlite3_reset(psVar16);
        if (iVar2 == 0) {
LAB_001bd1a4:
          uVar10 = *(uint *)((long)&ppTree->zMalloc + 4);
          iVar3 = fts3PrefixCompress(*(char **)&ppTree->nEntry,*(int *)&ppTree->zTerm,zNext,
                                     (int)pcVar9);
          iVar2 = 0x10b;
          uVar18 = iVar6 - iVar3;
          if (uVar18 != 0 && iVar3 <= iVar6) {
            local_c0 = (sqlite3_uint64)iVar6;
            local_b8 = ppTree;
            iVar2 = sqlite3Fts3VarintLen((long)iVar3);
            iVar4 = sqlite3Fts3VarintLen((ulong)uVar18);
            sVar1 = local_d0;
            iVar5 = sqlite3Fts3VarintLen(local_d0);
            ppTree = local_b8;
            iVar4 = iVar2 + (int)sVar1 + uVar18 + iVar4 + iVar5;
            if ((0 < (int)uVar10) && (p->nNodeSize < (int)(iVar4 + uVar10))) {
              pSVar7 = local_b8->pLeftmost;
              local_b8->pLeftmost = (SegmentNode *)((long)&pSVar7->pParent + 1);
              pcVar9 = (char *)(ulong)uVar10;
              iVar2 = fts3WriteSegment(p,(sqlite3_int64)pSVar7,*(char **)&local_b8->nData,uVar10);
              if (iVar2 != 0) goto LAB_001bd145;
              p->nLeafAdd = p->nLeafAdd + 1;
              pcVar9 = (char *)(ulong)(iVar3 + 1);
              iVar2 = fts3NodeAddTerm(p,&ppTree->pParent,(int)zNext,pcVar9,(int)uVar17);
              if (iVar2 != 0) goto LAB_001bd145;
              *(undefined4 *)&ppTree->zTerm = 0;
              iVar2 = sqlite3Fts3VarintLen(local_c0);
              uVar10 = (int)local_d0 + iVar6;
              pcVar9 = (char *)(ulong)uVar10;
              iVar4 = iVar5 + uVar10 + iVar2 + 1;
              uVar10 = 0;
              iVar3 = 0;
              uVar18 = iVar6;
            }
            ppTree->aData = ppTree->aData + iVar4;
            pvVar8 = *(void **)&ppTree->nData;
            if (*(int *)&ppTree->zMalloc < iVar4) {
              pvVar8 = sqlite3_realloc(pvVar8,iVar4);
              iVar2 = 7;
              if (pvVar8 == (void *)0x0) goto LAB_001bd145;
              *(void **)&ppTree->nData = pvVar8;
              *(int *)&ppTree->zMalloc = iVar4;
            }
            iVar2 = sqlite3Fts3PutVarint((char *)((long)pvVar8 + (long)(int)uVar10),(long)iVar3);
            iVar4 = sqlite3Fts3PutVarint
                              ((char *)(*(long *)&ppTree->nData + (long)(int)(uVar10 + iVar2)),
                               (long)(int)uVar18);
            iVar4 = uVar10 + iVar2 + iVar4;
            memcpy((void *)(*(long *)&ppTree->nData + (long)iVar4),zNext + iVar3,(long)(int)uVar18);
            sVar1 = local_d0;
            iVar4 = iVar4 + uVar18;
            iVar2 = sqlite3Fts3PutVarint((char *)(*(long *)&ppTree->nData + (long)iVar4),local_d0);
            iVar4 = iVar4 + iVar2;
            memcpy((void *)(*(long *)&ppTree->nData + (long)iVar4),local_b0,sVar1);
            *(int *)((long)&ppTree->zMalloc + 4) = iVar4 + (int)sVar1;
            if (*(int *)((long)&ppTree->zTerm + 4) < iVar6) {
              pvVar8 = sqlite3_realloc(*(void **)&ppTree->nTerm,iVar6 * 2);
              iVar2 = 7;
              if (pvVar8 == (void *)0x0) goto LAB_001bd145;
              *(int *)((long)&ppTree->zTerm + 4) = iVar6 * 2;
              *(void **)&ppTree->nTerm = pvVar8;
              *(void **)&ppTree->nEntry = pvVar8;
            }
            else {
              pvVar8 = *(void **)&ppTree->nEntry;
            }
            memcpy(pvVar8,zNext,local_c0);
            *(int *)&ppTree->zTerm = iVar6;
            iVar2 = 0;
          }
        }
      }
    }
  }
  goto LAB_001bd145;
}

Assistant:

static int fts3SegmentMerge(
  Fts3Table *p, 
  int iLangid,                    /* Language id to merge */
  int iIndex,                     /* Index in p->aIndex[] to merge */
  int iLevel                      /* Level to merge */
){
  int rc;                         /* Return code */
  int iIdx = 0;                   /* Index of new segment */
  sqlite3_int64 iNewLevel = 0;    /* Level/index to create new segment at */
  SegmentWriter *pWriter = 0;     /* Used to write the new, merged, segment */
  Fts3SegFilter filter;           /* Segment term filter condition */
  Fts3MultiSegReader csr;         /* Cursor to iterate through level(s) */
  int bIgnoreEmpty = 0;           /* True to ignore empty segments */
  i64 iMaxLevel = 0;              /* Max level number for this index/langid */

  assert( iLevel==FTS3_SEGCURSOR_ALL
       || iLevel==FTS3_SEGCURSOR_PENDING
       || iLevel>=0
  );
  assert( iLevel<FTS3_SEGDIR_MAXLEVEL );
  assert( iIndex>=0 && iIndex<p->nIndex );

  rc = sqlite3Fts3SegReaderCursor(p, iLangid, iIndex, iLevel, 0, 0, 1, 0, &csr);
  if( rc!=SQLITE_OK || csr.nSegment==0 ) goto finished;

  if( iLevel!=FTS3_SEGCURSOR_PENDING ){
    rc = fts3SegmentMaxLevel(p, iLangid, iIndex, &iMaxLevel);
    if( rc!=SQLITE_OK ) goto finished;
  }

  if( iLevel==FTS3_SEGCURSOR_ALL ){
    /* This call is to merge all segments in the database to a single
    ** segment. The level of the new segment is equal to the numerically
    ** greatest segment level currently present in the database for this
    ** index. The idx of the new segment is always 0.  */
    if( csr.nSegment==1 && 0==fts3SegReaderIsPending(csr.apSegment[0]) ){
      rc = SQLITE_DONE;
      goto finished;
    }
    iNewLevel = iMaxLevel;
    bIgnoreEmpty = 1;

  }else{
    /* This call is to merge all segments at level iLevel. find the next
    ** available segment index at level iLevel+1. The call to
    ** fts3AllocateSegdirIdx() will merge the segments at level iLevel+1 to 
    ** a single iLevel+2 segment if necessary.  */
    assert( FTS3_SEGCURSOR_PENDING==-1 );
    iNewLevel = getAbsoluteLevel(p, iLangid, iIndex, iLevel+1);
    rc = fts3AllocateSegdirIdx(p, iLangid, iIndex, iLevel+1, &iIdx);
    bIgnoreEmpty = (iLevel!=FTS3_SEGCURSOR_PENDING) && (iNewLevel>iMaxLevel);
  }
  if( rc!=SQLITE_OK ) goto finished;

  assert( csr.nSegment>0 );
  assert_fts3_nc( iNewLevel>=getAbsoluteLevel(p, iLangid, iIndex, 0) );
  assert_fts3_nc( 
    iNewLevel<getAbsoluteLevel(p, iLangid, iIndex,FTS3_SEGDIR_MAXLEVEL) 
  );

  memset(&filter, 0, sizeof(Fts3SegFilter));
  filter.flags = FTS3_SEGMENT_REQUIRE_POS;
  filter.flags |= (bIgnoreEmpty ? FTS3_SEGMENT_IGNORE_EMPTY : 0);

  rc = sqlite3Fts3SegReaderStart(p, &csr, &filter);
  while( SQLITE_OK==rc ){
    rc = sqlite3Fts3SegReaderStep(p, &csr);
    if( rc!=SQLITE_ROW ) break;
    rc = fts3SegWriterAdd(p, &pWriter, 1, 
        csr.zTerm, csr.nTerm, csr.aDoclist, csr.nDoclist);
  }
  if( rc!=SQLITE_OK ) goto finished;
  assert( pWriter || bIgnoreEmpty );

  if( iLevel!=FTS3_SEGCURSOR_PENDING ){
    rc = fts3DeleteSegdir(
        p, iLangid, iIndex, iLevel, csr.apSegment, csr.nSegment
    );
    if( rc!=SQLITE_OK ) goto finished;
  }
  if( pWriter ){
    rc = fts3SegWriterFlush(p, pWriter, iNewLevel, iIdx);
    if( rc==SQLITE_OK ){
      if( iLevel==FTS3_SEGCURSOR_PENDING || iNewLevel<iMaxLevel ){
        rc = fts3PromoteSegments(p, iNewLevel, pWriter->nLeafData);
      }
    }
  }

 finished:
  fts3SegWriterFree(pWriter);
  sqlite3Fts3SegReaderFinish(&csr);
  return rc;
}